

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O1

void __thiscall Itemset::print_idlist(Itemset *this,ostream *idlstrm)

{
  element_type *peVar1;
  int *piVar2;
  long lVar3;
  element_type *peVar4;
  ostream *poVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  peVar4 = (this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar4 == (element_type *)0x0) || (peVar4->theSize < 1)) {
    return;
  }
  peVar1 = (peVar4->theArray).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  piVar2 = *(int **)&(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
  if (*(pointer *)((long)&(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8) ==
      piVar2) {
    uVar9 = 0;
    uVar6 = 0;
LAB_00117451:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9,
               uVar6);
  }
  iVar8 = *piVar2;
  peVar4 = (this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4->theSize < 1) {
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    uVar9 = 0;
    do {
      peVar1 = (peVar4->theArray).
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar3 = *(long *)&(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
      uVar6 = (long)*(pointer *)
                     ((long)&(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8) -
              lVar3 >> 2;
      if (uVar6 <= uVar9) goto LAB_00117451;
      if (iVar8 == *(int *)(lVar3 + uVar9 * 4)) {
        iVar7 = iVar7 + 1;
        uVar9 = (ulong)((int)uVar9 + 2);
      }
      else {
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)idlstrm,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        peVar1 = (((this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 theArray).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        lVar3 = *(long *)&(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
        uVar6 = (long)*(pointer *)
                       ((long)&(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8)
                - lVar3 >> 2;
        if (uVar6 <= uVar9) goto LAB_00117451;
        iVar8 = *(int *)(lVar3 + uVar9 * 4);
        iVar7 = 0;
      }
      peVar4 = (this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    } while ((int)uVar9 < peVar4->theSize);
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)idlstrm,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::ostream::operator<<((ostream *)poVar5,iVar7);
  return;
}

Assistant:

void Itemset::print_idlist(ostream& idlstrm) {
    int i, cid, cnt;

    if (theIval && theIval->size() > 0) {
        cid = (*theIval)[0];
        cnt = 0;
        for (i = 0; i <theIval->size();) {
            if (cid == (*theIval)[i]) {
                cnt++;
                i += 2;
            } else {
                idlstrm << cid << " " << cnt << " ";
                cid = (*theIval)[i];
                cnt = 0;
            }
        }
        idlstrm << cid << " " << cnt;
    }
}